

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# named_local_mbox.cpp
# Opt level: O2

void __thiscall
so_5::impl::named_local_mbox_t::named_local_mbox_t
          (named_local_mbox_t *this,string *name,mbox_t *mbox,mbox_core_t *mbox_core)

{
  abstract_message_box_t *paVar1;
  
  abstract_message_box_t::abstract_message_box_t(&this->super_abstract_message_box_t);
  (this->super_abstract_message_box_t)._vptr_abstract_message_box_t =
       (_func_int **)&PTR__named_local_mbox_t_002c7b30;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  mbox_core_ref_t::mbox_core_ref_t(&this->m_mbox_core,mbox_core);
  paVar1 = mbox->m_obj;
  (this->m_mbox).m_obj = paVar1;
  if (paVar1 != (abstract_message_box_t *)0x0) {
    LOCK();
    (paVar1->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i =
         (paVar1->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i +
         1;
    UNLOCK();
  }
  return;
}

Assistant:

named_local_mbox_t::named_local_mbox_t(
	const std::string & name,
	const mbox_t & mbox,
	impl::mbox_core_t & mbox_core )
	:
		m_name( name ),
		m_mbox_core( &mbox_core ),
		m_mbox( mbox )
{
}